

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_appendADynArray_failure_nullptrDestArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  void *_ck_x;
  char *pcVar5;
  char *pcVar6;
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  pcVar3 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(pcVar3,"012",4);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray((void *)0x0,0xffffffffffffffff,pcVar3,3,1);
  if (bVar1 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x636);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x637);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x638);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x639);
    iVar2 = strcmp("012",pcVar3);
    if (iVar2 != 0) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x63a,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "srcArray.buffer == \"012\"","srcArray.buffer","\"",pcVar3,"\"","\"012\"",
                        "\"","012","\"",0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x63a);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x63b);
    if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x63c);
      private_ACUtilsTest_ADynArray_freeCount = private_ACUtilsTest_ADynArray_freeCount + 1;
      free(pcVar3);
      return;
    }
    pcVar6 = "0";
    pcVar3 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar2 = 0x63c;
    sVar4 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar4 = (size_t)bVar1;
    pcVar6 = "false";
    pcVar3 = 
    "(&srcArray == ((void*)0) ? destArrayPtr != ((void*)0) : private_ACUtils_ADynArray_insertArray(destArrayPtr, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(destArrayPtr)->buffer))) == false"
    ;
    pcVar5 = 
    "(&srcArray == ((void*)0) ? destArrayPtr != ((void*)0) : private_ACUtils_ADynArray_insertArray(destArrayPtr, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(destArrayPtr)->buffer)))"
    ;
    iVar2 = 0x636;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar3,pcVar5,sVar4,pcVar6,0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_failure_nullptrDestArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray *destArrayPtr = nullptr;
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "012", 4);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(destArrayPtr, &srcArray), false);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "012");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    srcArray.deallocator(srcArray.buffer);
}